

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool __thiscall
xatlas::internal::BitImage::canBlit
          (BitImage *this,BitImage *image,uint32_t offsetX,uint32_t offsetY)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar1 = image->m_height;
  bVar9 = uVar1 == 0;
  if (!bVar9) {
    uVar4 = 0;
    do {
      bVar6 = 0;
      if (uVar4 + offsetY < this->m_height) {
        uVar8 = 0;
        do {
          uVar5 = uVar8 + offsetX;
          bVar6 = 5;
          if (uVar5 < this->m_width) {
            uVar2 = (uVar5 >> 6) + (uVar4 + offsetY) * this->m_rowStride;
            if (((this->m_data).m_base.size <= uVar2) ||
               (uVar7 = (uVar8 >> 6) + image->m_rowStride * uVar4,
               (image->m_data).m_base.size <= uVar7)) {
              __assert_fail("index < m_base.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x4a8,
                            "const T &xatlas::internal::Array<unsigned long>::operator[](uint32_t) const [T = unsigned long]"
                           );
            }
            uVar5 = uVar5 & 0x3f;
            uVar3 = uVar8 & 0x3f;
            bVar6 = 1;
            if ((*(ulong *)((image->m_data).m_base.buffer + (ulong)uVar7 * 8) >> (sbyte)uVar3 &
                *(ulong *)((this->m_data).m_base.buffer + (ulong)uVar2 * 8) >> (sbyte)uVar5) == 0) {
              if (uVar3 < uVar5) {
                uVar3 = uVar5;
              }
              uVar8 = (uVar8 - uVar3) + 0x40;
              bVar6 = (image->m_width <= uVar8) * '\x05';
            }
          }
        } while (bVar6 == 0);
        if (bVar6 == 5) {
          bVar6 = 0;
        }
      }
      if ((bVar6 & 3) != 0) {
        return bVar9;
      }
      uVar4 = uVar4 + 1;
      bVar9 = uVar1 <= uVar4;
    } while (uVar4 != uVar1);
  }
  return bVar9;
}

Assistant:

bool canBlit(const BitImage &image, uint32_t offsetX, uint32_t offsetY) const
	{
		for (uint32_t y = 0; y < image.m_height; y++) {
			const uint32_t thisY = y + offsetY;
			if (thisY >= m_height)
				continue;
			uint32_t x = 0;
			for (;;) {
				const uint32_t thisX = x + offsetX;
				if (thisX >= m_width)
					break;
				const uint32_t thisBlockShift = thisX % 64;
				const uint64_t thisBlock = m_data[(thisX >> 6) + thisY * m_rowStride] >> thisBlockShift;
				const uint32_t blockShift = x % 64;
				const uint64_t block = image.m_data[(x >> 6) + y * image.m_rowStride] >> blockShift;
				if ((thisBlock & block) != 0)
					return false;
				x += 64 - max(thisBlockShift, blockShift);
				if (x >= image.m_width)
					break;
			}
		}
		return true;
	}